

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O2

ArrayPtr<const_unsigned_char> __thiscall
kj::BufferedInputStreamWrapper::tryGetReadBuffer(BufferedInputStreamWrapper *this)

{
  int iVar1;
  undefined4 extraout_var;
  uchar *puVar3;
  ArrayPtr<const_unsigned_char> AVar4;
  size_t sVar2;
  
  sVar2 = (this->bufferAvailable).size_;
  if (sVar2 == 0) {
    iVar1 = (*this->inner->_vptr_InputStream[2])
                      (this->inner,(this->buffer).ptr,(this->buffer).size_,1);
    sVar2 = CONCAT44(extraout_var,iVar1);
    puVar3 = (this->buffer).ptr;
    (this->bufferAvailable).ptr = puVar3;
    (this->bufferAvailable).size_ = sVar2;
  }
  else {
    puVar3 = (this->bufferAvailable).ptr;
  }
  AVar4.size_ = sVar2;
  AVar4.ptr = puVar3;
  return AVar4;
}

Assistant:

ArrayPtr<const byte> BufferedInputStreamWrapper::tryGetReadBuffer() {
  if (bufferAvailable.size() == 0) {
    size_t n = inner.tryRead(buffer, 1);
    bufferAvailable = buffer.first(n);
  }

  return bufferAvailable;
}